

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  double lat_env;
  double long_env;
  double alt_env;
  DWORD __seed;
  int iVar1;
  BOOL BVar2;
  char *pcVar3;
  FILE *__stream;
  double dVar4;
  double x;
  double y;
  double z;
  bool local_4b1;
  char local_478 [8];
  char hostname [256];
  char *username;
  char logappfilename [256];
  FILE *logappfile;
  CHRONO chrono_GNSS;
  THREAD_IDENTIFIER MissionArgThreadId;
  THREAD_IDENTIFIER CommandsThreadId;
  THREAD_IDENTIFIER MissionLogThreadId;
  THREAD_IDENTIFIER MissionThreadId;
  THREAD_IDENTIFIER ControllerThreadId;
  THREAD_IDENTIFIER ObserverThreadId;
  THREAD_IDENTIFIER PololuInterfaceThreadId;
  THREAD_IDENTIFIER SSC32InterfaceThreadId;
  THREAD_IDENTIFIER SBGInterfaceThreadId;
  THREAD_IDENTIFIER RoboteqInterfaceThreadId;
  THREAD_IDENTIFIER RazorAHRSInterfaceThreadId;
  THREAD_IDENTIFIER NMEAInterfaceThreadId;
  THREAD_IDENTIFIER LIRMIA3ThreadId;
  THREAD_IDENTIFIER OntrakThreadId;
  THREAD_IDENTIFIER IM483IThreadId;
  THREAD_IDENTIFIER RoboteqThreadId [2];
  THREAD_IDENTIFIER local_180;
  THREAD_IDENTIFIER MiniSSCThreadId;
  THREAD_IDENTIFIER PololuThreadId [3];
  THREAD_IDENTIFIER local_158;
  THREAD_IDENTIFIER SSC32ThreadId;
  THREAD_IDENTIFIER SwarmonDeviceThreadId;
  THREAD_IDENTIFIER ubloxThreadId [3];
  THREAD_IDENTIFIER NMEADeviceThreadId [2];
  THREAD_IDENTIFIER local_110;
  THREAD_IDENTIFIER SBGThreadId;
  THREAD_IDENTIFIER MTThreadId;
  THREAD_IDENTIFIER RazorAHRSThreadId;
  THREAD_IDENTIFIER P33xThreadId;
  THREAD_IDENTIFIER MS5837ThreadId;
  THREAD_IDENTIFIER MS580314BAThreadId;
  THREAD_IDENTIFIER ArduinoPressureSensorThreadId;
  THREAD_IDENTIFIER SRF02ThreadId;
  THREAD_IDENTIFIER RPLIDARThreadId;
  THREAD_IDENTIFIER HokuyoThreadId;
  THREAD_IDENTIFIER SeanetThreadId;
  THREAD_IDENTIFIER MDMThreadId;
  THREAD_IDENTIFIER MESThreadId;
  THREAD_IDENTIFIER NortekDVLThreadId;
  THREAD_IDENTIFIER PathfinderDVLThreadId;
  THREAD_IDENTIFIER SimulatorThreadId;
  THREAD_IDENTIFIER FollowMeThreadId;
  THREAD_IDENTIFIER ExternalProgramTriggerThreadId [8];
  THREAD_IDENTIFIER local_40;
  THREAD_IDENTIFIER SonarAltitudeEstimationThreadId;
  THREAD_IDENTIFIER SonarLocalizationThreadId;
  THREAD_IDENTIFIER SeanetProcessingThreadId;
  THREAD_IDENTIFIER gpControlThreadId;
  BOOL bGUIAvailable;
  int i;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  gpControlThreadId._4_4_ = 0;
  gpControlThreadId._0_4_ = 0;
  _bGUIAvailable = argv;
  argv_local._0_4_ = argc;
  setbuf(_stdout,(char *)0x0);
  __seed = GetTickCount();
  srand(__seed);
  printf("\nUxVCtrl V%d\n",(ulong)(uint)UxVCtrl_version);
  fflush(_stdout);
  pcVar3 = strtimeex_fns();
  sprintf((char *)&username,"log/logapp_%.64s.log",pcVar3);
  __stream = fopen((char *)&username,"w");
  if (__stream == (FILE *)0x0) {
    printf("Unable to create log file.\n");
  }
  else {
    pcVar3 = getenv("USERNAME");
    memset(local_478,0,0x100);
    gethostname(local_478,0x100);
    fprintf(__stream,"UxVCtrl V%d (%.255s on %.255s)\n",(ulong)(uint)UxVCtrl_version,pcVar3,
            local_478);
    fflush(__stream);
  }
  if ((int)argv_local == 2) {
    bMissionAtStartup = 1;
  }
  else {
    if (2 < (int)argv_local) {
      printf("Usage : \n\t%s mission.txt\n\t\tor\n\t%s\n",*_bGUIAvailable,*_bGUIAvailable);
      return 3;
    }
    bMissionAtStartup = 0;
  }
  InitNet();
  LoadConfig();
  LoadEnv();
  LoadKeys();
  InitGlobals();
  signal(0xd,(__sighandler_t)0x1);
  if (bDisablegpControl == 0) {
    CreateDefaultThread(gpControlThread,(void *)0x0,&SeanetProcessingThreadId);
  }
  CreateDefaultThread(SeanetProcessingThread,(void *)0x0,&SonarLocalizationThreadId);
  CreateDefaultThread(SonarLocalizationThread,(void *)0x0,&SonarAltitudeEstimationThreadId);
  CreateDefaultThread(SonarAltitudeEstimationThread,(void *)0x0,&local_40);
  for (gpControlThreadId._4_4_ = 0; gpControlThreadId._4_4_ < 8;
      gpControlThreadId._4_4_ = gpControlThreadId._4_4_ + 1) {
    if (bDisableExternalProgramTrigger == 0) {
      CreateDefaultThread(ExternalProgramTriggerThread,(void *)(long)gpControlThreadId._4_4_,
                          ExternalProgramTriggerThreadId + (long)gpControlThreadId._4_4_ + -1);
    }
  }
  if (bDisableFollowMe == 0) {
    CreateDefaultThread(FollowMeThread,(void *)0x0,&SimulatorThreadId);
  }
  if ((robid & 0x11111111U) != 0) {
    CreateDefaultThread(SimulatorThread,(void *)0x0,&PathfinderDVLThreadId);
  }
  if (bDisablePathfinderDVL == 0) {
    CreateDefaultThread(PathfinderDVLThread,(void *)0x0,&NortekDVLThreadId);
  }
  if (bDisableNortekDVL == 0) {
    CreateDefaultThread(NortekDVLThread,(void *)0x0,&MESThreadId);
  }
  if (bDisableMES == 0) {
    CreateDefaultThread(MESThread,(void *)0x0,&MDMThreadId);
  }
  if (bDisableMDM == 0) {
    CreateDefaultThread(MDMThread,(void *)0x0,&SeanetThreadId);
  }
  if (bDisableSeanet == 0) {
    CreateDefaultThread(SeanetThread,(void *)0x0,&HokuyoThreadId);
  }
  if (bDisableHokuyo == 0) {
    CreateDefaultThread(HokuyoThread,(void *)0x0,&RPLIDARThreadId);
  }
  if (bDisableRPLIDAR == 0) {
    CreateDefaultThread(RPLIDARThread,(void *)0x0,&SRF02ThreadId);
  }
  if (bDisableSRF02 == 0) {
    CreateDefaultThread(SRF02Thread,(void *)0x0,&ArduinoPressureSensorThreadId);
  }
  if (bDisableArduinoPressureSensor == 0) {
    CreateDefaultThread(ArduinoPressureSensorThread,(void *)0x0,&MS580314BAThreadId);
  }
  if (bDisableMS580314BA == 0) {
    CreateDefaultThread(MS580314BAThread,(void *)0x0,&MS5837ThreadId);
  }
  if (bDisableMS5837 == 0) {
    CreateDefaultThread(MS5837Thread,(void *)0x0,&P33xThreadId);
  }
  if (bDisableP33x == 0) {
    CreateDefaultThread(P33xThread,(void *)0x0,&RazorAHRSThreadId);
  }
  if (bDisableRazorAHRS == 0) {
    CreateDefaultThread(RazorAHRSThread,(void *)0x0,&MTThreadId);
  }
  if (bDisableMT == 0) {
    CreateDefaultThread(MTThread,(void *)0x0,&SBGThreadId);
  }
  if (bDisableSBG == 0) {
    CreateDefaultThread(SBGThread,(void *)0x0,&local_110);
  }
  for (gpControlThreadId._4_4_ = 0; gpControlThreadId._4_4_ < 2;
      gpControlThreadId._4_4_ = gpControlThreadId._4_4_ + 1) {
    if (bDisableNMEADevice[gpControlThreadId._4_4_] == 0) {
      CreateDefaultThread(NMEADeviceThread,(void *)(long)gpControlThreadId._4_4_,
                          NMEADeviceThreadId + (long)gpControlThreadId._4_4_ + -1);
    }
  }
  for (gpControlThreadId._4_4_ = 0; gpControlThreadId._4_4_ < 3;
      gpControlThreadId._4_4_ = gpControlThreadId._4_4_ + 1) {
    if (bDisableublox[gpControlThreadId._4_4_] == 0) {
      CreateDefaultThread(ubloxThread,(void *)(long)gpControlThreadId._4_4_,
                          ubloxThreadId + (long)gpControlThreadId._4_4_ + -1);
    }
  }
  if (bDisableSwarmonDevice == 0) {
    CreateDefaultThread(SwarmonDeviceThread,(void *)0x0,&SSC32ThreadId);
  }
  if (bDisableSSC32 == 0) {
    CreateDefaultThread(SSC32Thread,(void *)0x0,&local_158);
  }
  for (gpControlThreadId._4_4_ = 0; gpControlThreadId._4_4_ < 3;
      gpControlThreadId._4_4_ = gpControlThreadId._4_4_ + 1) {
    if (bDisablePololu[gpControlThreadId._4_4_] == 0) {
      CreateDefaultThread(PololuThread,(void *)(long)gpControlThreadId._4_4_,
                          PololuThreadId + (long)gpControlThreadId._4_4_ + -1);
    }
  }
  if (bDisableMiniSSC == 0) {
    CreateDefaultThread(MiniSSCThread,(void *)0x0,&local_180);
  }
  for (gpControlThreadId._4_4_ = 0; gpControlThreadId._4_4_ < 2;
      gpControlThreadId._4_4_ = gpControlThreadId._4_4_ + 1) {
    if (bDisableRoboteq[gpControlThreadId._4_4_] == 0) {
      CreateDefaultThread(RoboteqThread,(void *)(long)gpControlThreadId._4_4_,
                          RoboteqThreadId + (long)gpControlThreadId._4_4_ + -1);
    }
  }
  if (bDisableIM483I == 0) {
    CreateDefaultThread(IM483IThread,(void *)0x0,&OntrakThreadId);
  }
  if (bDisableOntrak == 0) {
    CreateDefaultThread(OntrakThread,(void *)0x0,&LIRMIA3ThreadId);
  }
  if (robid == 0x80) {
    CreateDefaultThread(LIRMIA3Thread,(void *)0x0,&NMEAInterfaceThreadId);
  }
  if ((0 < WaitForGNSSLevel) && (0 < WaitForGNSSTimeout)) {
    StartChrono((CHRONO *)&logappfile);
    printf("Waiting for GNSS...\n");
    while (iVar1 = GetGNSSlevel(), iVar1 < WaitForGNSSLevel) {
      dVar4 = GetTimeElapsedChronoQuick((CHRONO *)&logappfile);
      if ((double)WaitForGNSSTimeout / 1000.0 < dVar4) {
        printf("Timeout waiting for GNSS.\n");
        break;
      }
      mSleep(100);
    }
    StopChronoQuick((CHRONO *)&logappfile);
  }
  if (bSetEnvOriginFromGNSS != 0) {
    BVar2 = bCheckGNSSOK();
    alt_env = ::alt_env;
    long_env = ::long_env;
    lat_env = ::lat_env;
    dVar4 = angle_env;
    if (BVar2 == 0) {
      printf("Unable to set environment origin from GNSS.\n");
    }
    else {
      x = Center((interval *)&x_gps);
      y = Center((interval *)&y_gps);
      z = Center((interval *)&z_gps);
      EnvCoordSystem2GPS(lat_env,long_env,alt_env,dVar4,x,y,z,&lat_home,&long_home,&alt_home);
      ::lat_env = lat_home;
      ::long_env = long_home;
      ::alt_env = alt_home;
    }
  }
  if (bNMEAInterface != 0) {
    CreateDefaultThread(NMEAInterfaceThread,(void *)0x0,&RazorAHRSInterfaceThreadId);
  }
  if (bNMEAInterface != 0) {
    DetachThread(RazorAHRSInterfaceThreadId);
  }
  if (bRazorAHRSInterface != 0) {
    CreateDefaultThread(RazorAHRSInterfaceThread,(void *)0x0,&RoboteqInterfaceThreadId);
  }
  if (bRazorAHRSInterface != 0) {
    DetachThread(RoboteqInterfaceThreadId);
  }
  if (bRoboteqInterface != 0) {
    CreateDefaultThread(RoboteqInterfaceThread,(void *)0x0,&SBGInterfaceThreadId);
  }
  if (bRoboteqInterface != 0) {
    DetachThread(SBGInterfaceThreadId);
  }
  if (bSBGInterface != 0) {
    CreateDefaultThread(SBGInterfaceThread,(void *)0x0,&SSC32InterfaceThreadId);
  }
  if (bSBGInterface != 0) {
    DetachThread(SSC32InterfaceThreadId);
  }
  if (bSSC32Interface != 0) {
    CreateDefaultThread(SSC32InterfaceThread,(void *)0x0,&PololuInterfaceThreadId);
  }
  if (bSSC32Interface != 0) {
    DetachThread(PololuInterfaceThreadId);
  }
  if (bPololuInterface != 0) {
    CreateDefaultThread(PololuInterfaceThread,(void *)0x0,&ObserverThreadId);
  }
  if (bPololuInterface != 0) {
    DetachThread(ObserverThreadId);
  }
  CreateDefaultThread(ObserverThread,(void *)0x0,&ControllerThreadId);
  CreateDefaultThread(ControllerThread,(void *)0x0,&MissionThreadId);
  CreateDefaultThread(MissionThread,(void *)0x0,&MissionLogThreadId);
  CreateDefaultThread(MissionLogThread,(void *)0x0,&CommandsThreadId);
  if (bCommandPrompt != 0) {
    CreateDefaultThread(CommandsThread,(void *)0x0,&MissionArgThreadId);
  }
  if ((bCommandPrompt != 0) && (bDetachCommandsThread != 0)) {
    DetachThread(MissionArgThreadId);
  }
  if (bMissionAtStartup == 0) {
    gpControlThreadId._0_4_ = 0;
    for (gpControlThreadId._4_4_ = 0; gpControlThreadId._4_4_ < nbopencvgui;
        gpControlThreadId._4_4_ = gpControlThreadId._4_4_ + 1) {
      local_4b1 = true;
      if ((uint)gpControlThreadId == 0) {
        local_4b1 = bEnableOpenCVGUIs[gpControlThreadId._4_4_] != 0;
      }
      gpControlThreadId._0_4_ = (uint)local_4b1;
    }
    if ((bCommandPrompt == 0) && ((uint)gpControlThreadId == 0)) {
      printf(
            "No mission file specified as argument, command prompt disabled, no video GUI : will stop.\n"
            );
      bExit = 1;
      ExitCode = 3;
    }
  }
  else {
    CreateDefaultThread(MissionArgThread,_bGUIAvailable[1],
                        (THREAD_IDENTIFIER *)&chrono_GNSS.Suspended);
  }
  if (bMissionAtStartup != 0) {
    WaitForThread(chrono_GNSS._64_8_);
  }
  if (bCommandPrompt != 0) {
    if (bDetachCommandsThread == 0) {
      WaitForThread(MissionArgThreadId);
    }
    else {
      mSleep(100);
    }
  }
  WaitForThread(CommandsThreadId);
  WaitForThread(MissionLogThreadId);
  WaitForThread(MissionThreadId);
  WaitForThread(ControllerThreadId);
  if (bPololuInterface != 0) {
    mSleep(100);
  }
  if (bSSC32Interface != 0) {
    mSleep(100);
  }
  if (bSBGInterface != 0) {
    mSleep(100);
  }
  if (bRoboteqInterface != 0) {
    mSleep(100);
  }
  if (bRazorAHRSInterface != 0) {
    mSleep(100);
  }
  if (bNMEAInterface != 0) {
    mSleep(100);
  }
  if (robid == 0x80) {
    WaitForThread(NMEAInterfaceThreadId);
  }
  if (bDisableOntrak == 0) {
    WaitForThread(LIRMIA3ThreadId);
  }
  if (bDisableIM483I == 0) {
    WaitForThread(OntrakThreadId);
  }
  for (gpControlThreadId._4_4_ = 1; -1 < gpControlThreadId._4_4_;
      gpControlThreadId._4_4_ = gpControlThreadId._4_4_ + -1) {
    if (bDisableRoboteq[gpControlThreadId._4_4_] == 0) {
      WaitForThread(RoboteqThreadId[(long)gpControlThreadId._4_4_ + -1]);
    }
  }
  if (bDisableMiniSSC == 0) {
    WaitForThread(local_180);
  }
  for (gpControlThreadId._4_4_ = 2; -1 < gpControlThreadId._4_4_;
      gpControlThreadId._4_4_ = gpControlThreadId._4_4_ + -1) {
    if (bDisablePololu[gpControlThreadId._4_4_] == 0) {
      WaitForThread(PololuThreadId[(long)gpControlThreadId._4_4_ + -1]);
    }
  }
  if (bDisableSSC32 == 0) {
    WaitForThread(local_158);
  }
  if (bDisableSwarmonDevice == 0) {
    WaitForThread(SSC32ThreadId);
  }
  for (gpControlThreadId._4_4_ = 2; -1 < gpControlThreadId._4_4_;
      gpControlThreadId._4_4_ = gpControlThreadId._4_4_ + -1) {
    if (bDisableublox[gpControlThreadId._4_4_] == 0) {
      WaitForThread(ubloxThreadId[(long)gpControlThreadId._4_4_ + -1]);
    }
  }
  for (gpControlThreadId._4_4_ = 1; -1 < gpControlThreadId._4_4_;
      gpControlThreadId._4_4_ = gpControlThreadId._4_4_ + -1) {
    if (bDisableNMEADevice[gpControlThreadId._4_4_] == 0) {
      WaitForThread(NMEADeviceThreadId[(long)gpControlThreadId._4_4_ + -1]);
    }
  }
  if (bDisableSBG == 0) {
    WaitForThread(local_110);
  }
  if (bDisableMT == 0) {
    WaitForThread(SBGThreadId);
  }
  if (bDisableRazorAHRS == 0) {
    WaitForThread(MTThreadId);
  }
  if (bDisableP33x == 0) {
    WaitForThread(RazorAHRSThreadId);
  }
  if (bDisableMS5837 == 0) {
    WaitForThread(P33xThreadId);
  }
  if (bDisableMS580314BA == 0) {
    WaitForThread(MS5837ThreadId);
  }
  if (bDisableArduinoPressureSensor == 0) {
    WaitForThread(MS580314BAThreadId);
  }
  if (bDisableSRF02 == 0) {
    WaitForThread(ArduinoPressureSensorThreadId);
  }
  if (bDisableRPLIDAR == 0) {
    WaitForThread(SRF02ThreadId);
  }
  if (bDisableHokuyo == 0) {
    WaitForThread(RPLIDARThreadId);
  }
  if (bDisableSeanet == 0) {
    WaitForThread(HokuyoThreadId);
  }
  if (bDisableMDM == 0) {
    WaitForThread(SeanetThreadId);
  }
  if (bDisableMES == 0) {
    WaitForThread(MDMThreadId);
  }
  if (bDisableNortekDVL == 0) {
    WaitForThread(MESThreadId);
  }
  if (bDisablePathfinderDVL == 0) {
    WaitForThread(NortekDVLThreadId);
  }
  if ((robid & 0x11111111U) != 0) {
    WaitForThread(PathfinderDVLThreadId);
  }
  if (bDisableFollowMe == 0) {
    WaitForThread(SimulatorThreadId);
  }
  for (gpControlThreadId._4_4_ = 7; -1 < gpControlThreadId._4_4_;
      gpControlThreadId._4_4_ = gpControlThreadId._4_4_ + -1) {
    if (bDisableExternalProgramTrigger == 0) {
      WaitForThread(ExternalProgramTriggerThreadId[(long)gpControlThreadId._4_4_ + -1]);
    }
  }
  WaitForThread(local_40);
  WaitForThread(SonarAltitudeEstimationThreadId);
  WaitForThread(SonarLocalizationThreadId);
  if (bDisablegpControl == 0) {
    WaitForThread(SeanetProcessingThreadId);
  }
  ReleaseGlobals();
  UnloadEnv();
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  if (ExitCode == 0) {
    unlink("log/CurLbl.txt");
    unlink("log/CurWp.txt");
  }
  return ExitCode;
}

Assistant:

int main(int argc, char* argv[])
{
	int i = 0;
	BOOL bGUIAvailable = FALSE;
	THREAD_IDENTIFIER gpControlThreadId;
#ifndef DISABLE_OPENCV_SUPPORT
	THREAD_IDENTIFIER VideoThreadId[MAX_NB_VIDEO];
	THREAD_IDENTIFIER VideoRecordThreadId[MAX_NB_VIDEO];
#endif // !DISABLE_OPENCV_SUPPORT
#ifndef ENABLE_BUILD_OPTIMIZATION_SAILBOAT
	THREAD_IDENTIFIER SeanetProcessingThreadId;
	THREAD_IDENTIFIER SonarLocalizationThreadId;
	THREAD_IDENTIFIER SonarAltitudeEstimationThreadId;
#ifndef DISABLE_OPENCV_SUPPORT
	THREAD_IDENTIFIER ExternalVisualLocalizationThreadId;
	THREAD_IDENTIFIER WallThreadId;
#endif // !DISABLE_OPENCV_SUPPORT
#endif // !ENABLE_BUILD_OPTIMIZATION_SAILBOAT
#ifndef DISABLE_OPENCV_SUPPORT
	THREAD_IDENTIFIER BallThreadId[MAX_NB_BALL];
#endif // !DISABLE_OPENCV_SUPPORT
#ifndef ENABLE_BUILD_OPTIMIZATION_SAILBOAT
#ifndef DISABLE_OPENCV_SUPPORT
	THREAD_IDENTIFIER SurfaceVisualObstacleThreadId;
	THREAD_IDENTIFIER ObstacleThreadId;
	THREAD_IDENTIFIER PingerThreadId;
#endif // !DISABLE_OPENCV_SUPPORT
	THREAD_IDENTIFIER ExternalProgramTriggerThreadId[MAX_NB_EXTERNALPROGRAMTRIGGER];
	THREAD_IDENTIFIER FollowMeThreadId;
	THREAD_IDENTIFIER SimulatorThreadId;
	THREAD_IDENTIFIER PathfinderDVLThreadId;
	THREAD_IDENTIFIER NortekDVLThreadId;
	THREAD_IDENTIFIER MESThreadId;
	THREAD_IDENTIFIER MDMThreadId;
	THREAD_IDENTIFIER SeanetThreadId;
#ifdef ENABLE_BLUEVIEW_SUPPORT
	THREAD_IDENTIFIER BlueViewThreadId[MAX_NB_BLUEVIEW];
#endif // ENABLE_BLUEVIEW_SUPPORT
	THREAD_IDENTIFIER HokuyoThreadId;
	THREAD_IDENTIFIER RPLIDARThreadId;
	THREAD_IDENTIFIER SRF02ThreadId;
	THREAD_IDENTIFIER ArduinoPressureSensorThreadId;
	THREAD_IDENTIFIER MS580314BAThreadId;
	THREAD_IDENTIFIER MS5837ThreadId;
	THREAD_IDENTIFIER P33xThreadId;
#endif // !ENABLE_BUILD_OPTIMIZATION_SAILBOAT
	THREAD_IDENTIFIER RazorAHRSThreadId;
#ifndef ENABLE_BUILD_OPTIMIZATION_SAILBOAT
	THREAD_IDENTIFIER MTThreadId;
	THREAD_IDENTIFIER SBGThreadId;
#endif // !ENABLE_BUILD_OPTIMIZATION_SAILBOAT
	THREAD_IDENTIFIER NMEADeviceThreadId[MAX_NB_NMEADEVICE];
#ifndef ENABLE_BUILD_OPTIMIZATION_SAILBOAT
	THREAD_IDENTIFIER ubloxThreadId[MAX_NB_UBLOX];
#ifdef ENABLE_MAVLINK_SUPPORT
	THREAD_IDENTIFIER MAVLinkDeviceThreadId[MAX_NB_MAVLINKDEVICE];
#endif // ENABLE_MAVLINK_SUPPORT
	THREAD_IDENTIFIER SwarmonDeviceThreadId;
#ifdef ENABLE_LABJACK_SUPPORT
	THREAD_IDENTIFIER UE9AThreadId;
#endif // ENABLE_LABJACK_SUPPORT
	THREAD_IDENTIFIER SSC32ThreadId;
#endif // !ENABLE_BUILD_OPTIMIZATION_SAILBOAT
	THREAD_IDENTIFIER PololuThreadId[MAX_NB_POLOLU];
#ifndef ENABLE_BUILD_OPTIMIZATION_SAILBOAT
	THREAD_IDENTIFIER MiniSSCThreadId;
	THREAD_IDENTIFIER RoboteqThreadId[MAX_NB_ROBOTEQ];
	THREAD_IDENTIFIER IM483IThreadId;
	THREAD_IDENTIFIER OntrakThreadId;
#ifdef ENABLE_LIBMODBUS_SUPPORT
	THREAD_IDENTIFIER CISCREAThreadId;
#endif // ENABLE_LIBMODBUS_SUPPORT
	THREAD_IDENTIFIER LIRMIA3ThreadId;
#endif // !ENABLE_BUILD_OPTIMIZATION_SAILBOAT
#ifdef ENABLE_MAVLINK_SUPPORT
	THREAD_IDENTIFIER MAVLinkInterfaceThreadId;
#endif // ENABLE_MAVLINK_SUPPORT
#ifndef ENABLE_BUILD_OPTIMIZATION_SAILBOAT
	THREAD_IDENTIFIER NMEAInterfaceThreadId;
	THREAD_IDENTIFIER RazorAHRSInterfaceThreadId;
	THREAD_IDENTIFIER RoboteqInterfaceThreadId;
	THREAD_IDENTIFIER SBGInterfaceThreadId;
#ifdef ENABLE_MAVLINK_SUPPORT
	THREAD_IDENTIFIER VectorNavInterfaceThreadId;
#endif // ENABLE_MAVLINK_SUPPORT
	THREAD_IDENTIFIER SSC32InterfaceThreadId;
	THREAD_IDENTIFIER PololuInterfaceThreadId;
#endif // !ENABLE_BUILD_OPTIMIZATION_SAILBOAT
#ifndef DISABLE_OPENCV_SUPPORT
	THREAD_IDENTIFIER VideoInterfaceThreadId;
#endif // !DISABLE_OPENCV_SUPPORT
	THREAD_IDENTIFIER ObserverThreadId;
	THREAD_IDENTIFIER ControllerThreadId;
	THREAD_IDENTIFIER MissionThreadId;
	THREAD_IDENTIFIER MissionLogThreadId;
	THREAD_IDENTIFIER CommandsThreadId;
#ifndef DISABLE_OPENCV_SUPPORT
	THREAD_IDENTIFIER OpenCVGUIThreadId[MAX_NB_VIDEO];
#endif // !DISABLE_OPENCV_SUPPORT
#ifndef DISABLE_MISSIONARG_THREAD
	THREAD_IDENTIFIER MissionArgThreadId;
#endif // !DISABLE_MISSIONARG_THREAD
	CHRONO chrono_GNSS;
#ifndef DISABLE_LOGAPP
	FILE* logappfile = NULL;
	char logappfilename[MAX_BUF_LEN];
	char* username = NULL;
	char hostname[MAX_BUF_LEN];
#endif // !DISABLE_LOGAPP

	INIT_DEBUG;

#if !defined(_WIN32) && defined(ENABLE_VALGRIND_DEBUG)
	VALGRIND_DO_LEAK_CHECK;
#endif // !defined(_WIN32) && defined(ENABLE_VALGRIND_DEBUG)

	// Disable buffering for printf()...
	setbuf(stdout, NULL);

	srand(GetTickCount());

	printf("\nUxVCtrl V%d\n", UxVCtrl_version);
	fflush(stdout);

#ifndef DISABLE_LOGAPP
	sprintf(logappfilename, LOG_FOLDER"logapp_%.64s.log", strtimeex_fns());
	logappfile = fopen(logappfilename, "w");
	if (logappfile == NULL)
	{
		printf("Unable to create log file.\n");
	}
	else
	{
		username = getenv("USERNAME");
		memset(hostname, 0, sizeof(hostname));
		gethostname(hostname, sizeof(hostname));
		fprintf(logappfile, "UxVCtrl V%d (%.255s on %.255s)\n", UxVCtrl_version, username, hostname);
		fflush(logappfile);
	}
#endif // !DISABLE_LOGAPP

	// Will launch a mission file if specified as argument.
	if (argc == 2) bMissionAtStartup = TRUE;
	else if (argc > 2) {
		printf(
			"Usage : \n"
			"\t%s mission.txt\n"
			"\t\tor\n"
			"\t%s\n",
			argv[0], argv[0]);
		return EXIT_INVALID_PARAMETER;
	}
	else bMissionAtStartup = FALSE;

	InitNet();

	LoadConfig();
	LoadEnv();
	LoadKeys();
	InitGlobals();

#ifdef _WIN32
	// Prevent display/system sleep...
	SetThreadExecutionState(ES_CONTINUOUS|ES_DISPLAY_REQUIRED);
	//SetThreadExecutionState(ES_CONTINUOUS|ES_SYSTEM_REQUIRED);
#else
#ifndef DISABLE_IGNORE_SIGPIPE
	// See https://stackoverflow.com/questions/17332646/server-dies-on-send-if-client-was-closed-with-ctrlc...
	if (signal(SIGPIPE, SIG_IGN) == SIG_ERR)
	{
		PRINT_DEBUG_WARNING(("signal failed. \n"));
	}
#endif // DISABLE_IGNORE_SIGPIPE
#endif // _WIN32

//#ifdef _WIN32
//	// Need <direct.h>...
//	_mkdir(LOG_FOLDER); _mkdir(PIC_FOLDER); _mkdir(VID_FOLDER); _mkdir(AUD_FOLDER);
//#else
//	// Need <sys/stat.h> and <sys/types.h>...
//	mkdir(LOG_FOLDER, 0777); mkdir(PIC_FOLDER, 0777); mkdir(VID_FOLDER, 0777); mkdir(AUD_FOLDER, 0777);
//#endif // _WIN32

	// Launch sensors, actuators, algorithms thread loops and wait for them to be ready...
	if (!bDisablegpControl) CreateDefaultThread(gpControlThread, NULL, &gpControlThreadId);
#ifndef DISABLE_OPENCV_SUPPORT
	for (i = 0; i < MAX_NB_VIDEO; i++)
	{
		if (!bDisableVideo[i]) CreateDefaultThread(VideoThread, (void*)(intptr_t)i, &VideoThreadId[i]);
		if (!bDisableVideo[i]) CreateDefaultThread(VideoRecordThread, (void*)(intptr_t)i, &VideoRecordThreadId[i]);
	}
#endif // !DISABLE_OPENCV_SUPPORT
#ifndef ENABLE_BUILD_OPTIMIZATION_SAILBOAT
	CreateDefaultThread(SeanetProcessingThread, NULL, &SeanetProcessingThreadId);
	CreateDefaultThread(SonarLocalizationThread, NULL, &SonarLocalizationThreadId);
	CreateDefaultThread(SonarAltitudeEstimationThread, NULL, &SonarAltitudeEstimationThreadId);
#ifndef DISABLE_OPENCV_SUPPORT
	if (!bDisableExternalVisualLocalization) CreateDefaultThread(ExternalVisualLocalizationThread, NULL, &ExternalVisualLocalizationThreadId);
	if (!bDisableWall) CreateDefaultThread(WallThread, NULL, &WallThreadId);
#endif // !DISABLE_OPENCV_SUPPORT
#endif // !ENABLE_BUILD_OPTIMIZATION_SAILBOAT
#ifndef DISABLE_OPENCV_SUPPORT
	for (i = 0; i < MAX_NB_BALL; i++)
	{
		if (!bDisableBall) CreateDefaultThread(BallThread, (void*)(intptr_t)i, &BallThreadId[i]);
	}
#endif // !DISABLE_OPENCV_SUPPORT
#ifndef ENABLE_BUILD_OPTIMIZATION_SAILBOAT
#ifndef DISABLE_OPENCV_SUPPORT
	CreateDefaultThread(SurfaceVisualObstacleThread, NULL, &SurfaceVisualObstacleThreadId);
	CreateDefaultThread(ObstacleThread, NULL, &ObstacleThreadId);
	if (!bDisablePinger) CreateDefaultThread(PingerThread, NULL, &PingerThreadId);
#endif // !DISABLE_OPENCV_SUPPORT
	for (i = 0; i < MAX_NB_EXTERNALPROGRAMTRIGGER; i++)
	{
		if (!bDisableExternalProgramTrigger) CreateDefaultThread(ExternalProgramTriggerThread, (void*)(intptr_t)i, &ExternalProgramTriggerThreadId[i]);
	}
	if (!bDisableFollowMe) CreateDefaultThread(FollowMeThread, NULL, &FollowMeThreadId);
	if (robid & SIMULATOR_ROBID_MASK) CreateDefaultThread(SimulatorThread, NULL, &SimulatorThreadId);
	if (!bDisablePathfinderDVL) CreateDefaultThread(PathfinderDVLThread, NULL, &PathfinderDVLThreadId);
	if (!bDisableNortekDVL) CreateDefaultThread(NortekDVLThread, NULL, &NortekDVLThreadId);
	if (!bDisableMES) CreateDefaultThread(MESThread, NULL, &MESThreadId);
	if (!bDisableMDM) CreateDefaultThread(MDMThread, NULL, &MDMThreadId);
	if (!bDisableSeanet) CreateDefaultThread(SeanetThread, NULL, &SeanetThreadId);
#ifdef ENABLE_BLUEVIEW_SUPPORT
	for (i = 0; i < MAX_NB_BLUEVIEW; i++)
	{
		if (!bDisableBlueView[i]) CreateDefaultThread(BlueViewThread, (void*)(intptr_t)i, &BlueViewThreadId[i]);
	}
#endif // ENABLE_BLUEVIEW_SUPPORT
	if (!bDisableHokuyo) CreateDefaultThread(HokuyoThread, NULL, &HokuyoThreadId);
	if (!bDisableRPLIDAR) CreateDefaultThread(RPLIDARThread, NULL, &RPLIDARThreadId);
	if (!bDisableSRF02) CreateDefaultThread(SRF02Thread, NULL, &SRF02ThreadId);
	if (!bDisableArduinoPressureSensor) CreateDefaultThread(ArduinoPressureSensorThread, NULL, &ArduinoPressureSensorThreadId);
	if (!bDisableMS580314BA) CreateDefaultThread(MS580314BAThread, NULL, &MS580314BAThreadId);
	if (!bDisableMS5837) CreateDefaultThread(MS5837Thread, NULL, &MS5837ThreadId);
	if (!bDisableP33x) CreateDefaultThread(P33xThread, NULL, &P33xThreadId);
#endif // !ENABLE_BUILD_OPTIMIZATION_SAILBOAT
	if (!bDisableRazorAHRS) CreateDefaultThread(RazorAHRSThread, NULL, &RazorAHRSThreadId);
#ifndef ENABLE_BUILD_OPTIMIZATION_SAILBOAT
	if (!bDisableMT) CreateDefaultThread(MTThread, NULL, &MTThreadId);
	if (!bDisableSBG) CreateDefaultThread(SBGThread, NULL, &SBGThreadId);
#endif // !ENABLE_BUILD_OPTIMIZATION_SAILBOAT
	for (i = 0; i < MAX_NB_NMEADEVICE; i++)
	{
		if (!bDisableNMEADevice[i]) CreateDefaultThread(NMEADeviceThread, (void*)(intptr_t)i, &NMEADeviceThreadId[i]);
	}
#ifndef ENABLE_BUILD_OPTIMIZATION_SAILBOAT
	for (i = 0; i < MAX_NB_UBLOX; i++)
	{
		if (!bDisableublox[i]) CreateDefaultThread(ubloxThread, (void*)(intptr_t)i, &ubloxThreadId[i]);
	}
#ifdef ENABLE_MAVLINK_SUPPORT
	for (i = 0; i < MAX_NB_MAVLINKDEVICE; i++)
	{
		if (!bDisableMAVLinkDevice[i]) CreateDefaultThread(MAVLinkDeviceThread, (void*)(intptr_t)i, &MAVLinkDeviceThreadId[i]);
	}
#endif // ENABLE_MAVLINK_SUPPORT
	if (!bDisableSwarmonDevice) CreateDefaultThread(SwarmonDeviceThread, NULL, &SwarmonDeviceThreadId);
#ifdef ENABLE_LABJACK_SUPPORT
	if (!bDisableUE9A) CreateDefaultThread(UE9AThread, NULL, &UE9AThreadId);
#endif // ENABLE_LABJACK_SUPPORT
	if (!bDisableSSC32) CreateDefaultThread(SSC32Thread, NULL, &SSC32ThreadId);
#endif // !ENABLE_BUILD_OPTIMIZATION_SAILBOAT
	for (i = 0; i < MAX_NB_POLOLU; i++)
	{
		if (!bDisablePololu[i]) CreateDefaultThread(PololuThread, (void*)(intptr_t)i, &PololuThreadId[i]);
	}
#ifndef ENABLE_BUILD_OPTIMIZATION_SAILBOAT
	if (!bDisableMiniSSC) CreateDefaultThread(MiniSSCThread, NULL, &MiniSSCThreadId);
	for (i = 0; i < MAX_NB_ROBOTEQ; i++)
	{
		if (!bDisableRoboteq[i]) CreateDefaultThread(RoboteqThread, (void*)(intptr_t)i, &RoboteqThreadId[i]);
	}
	if (!bDisableIM483I) CreateDefaultThread(IM483IThread, NULL, &IM483IThreadId);
	if (!bDisableOntrak) CreateDefaultThread(OntrakThread, NULL, &OntrakThreadId);
#ifdef ENABLE_LIBMODBUS_SUPPORT
	if (robid == CISCREA_ROBID) CreateDefaultThread(CISCREAThread, NULL, &CISCREAThreadId);
#endif // ENABLE_LIBMODBUS_SUPPORT
	if (robid == LIRMIA3_ROBID) CreateDefaultThread(LIRMIA3Thread, NULL, &LIRMIA3ThreadId);
#endif // !ENABLE_BUILD_OPTIMIZATION_SAILBOAT

	if ((WaitForGNSSLevel > 0)&&(WaitForGNSSTimeout > 0))
	{
		StartChrono(&chrono_GNSS);
		printf("Waiting for GNSS...\n");
		while (GetGNSSlevel() < WaitForGNSSLevel)
		{
			if (GetTimeElapsedChronoQuick(&chrono_GNSS) > WaitForGNSSTimeout/1000.0)
			{
				printf("Timeout waiting for GNSS.\n");
				break;
			}
			mSleep(100);
		}
		StopChronoQuick(&chrono_GNSS);
	}
	if (bSetEnvOriginFromGNSS)
	{
		if (bCheckGNSSOK())
		{
			EnvCoordSystem2GPS(lat_env, long_env, alt_env, angle_env, Center(x_gps), Center(y_gps), Center(z_gps), &lat_home, &long_home, &alt_home);
			lat_env = lat_home; long_env = long_home; alt_env = alt_home;
		}
		else
		{
			printf("Unable to set environment origin from GNSS.\n");
		}
	}

#ifdef ENABLE_MAVLINK_SUPPORT
	if (bMAVLinkInterface) CreateDefaultThread(MAVLinkInterfaceThread, NULL, &MAVLinkInterfaceThreadId);
	if (bMAVLinkInterface) DetachThread(MAVLinkInterfaceThreadId); // Not easy to stop it correctly...
#endif // ENABLE_MAVLINK_SUPPORT
#ifndef ENABLE_BUILD_OPTIMIZATION_SAILBOAT
	if (bNMEAInterface) CreateDefaultThread(NMEAInterfaceThread, NULL, &NMEAInterfaceThreadId);
	if (bNMEAInterface) DetachThread(NMEAInterfaceThreadId); // Not easy to stop it correctly...
	if (bRazorAHRSInterface) CreateDefaultThread(RazorAHRSInterfaceThread, NULL, &RazorAHRSInterfaceThreadId);
	if (bRazorAHRSInterface) DetachThread(RazorAHRSInterfaceThreadId); // Not easy to stop it correctly...
	if (bRoboteqInterface) CreateDefaultThread(RoboteqInterfaceThread, NULL, &RoboteqInterfaceThreadId);
	if (bRoboteqInterface) DetachThread(RoboteqInterfaceThreadId); // Not easy to stop it correctly...
	if (bSBGInterface) CreateDefaultThread(SBGInterfaceThread, NULL, &SBGInterfaceThreadId);
	if (bSBGInterface) DetachThread(SBGInterfaceThreadId); // Not easy to stop it correctly...
#ifdef ENABLE_MAVLINK_SUPPORT
	if (bVectorNavInterface) CreateDefaultThread(VectorNavInterfaceThread, NULL, &VectorNavInterfaceThreadId);
	if (bVectorNavInterface) DetachThread(VectorNavInterfaceThreadId); // Not easy to stop it correctly...
#endif // ENABLE_MAVLINK_SUPPORT
	if (bSSC32Interface) CreateDefaultThread(SSC32InterfaceThread, NULL, &SSC32InterfaceThreadId);
	if (bSSC32Interface) DetachThread(SSC32InterfaceThreadId); // Not easy to stop it correctly...
	if (bPololuInterface) CreateDefaultThread(PololuInterfaceThread, NULL, &PololuInterfaceThreadId);
	if (bPololuInterface) DetachThread(PololuInterfaceThreadId); // Not easy to stop it correctly...
#endif // !ENABLE_BUILD_OPTIMIZATION_SAILBOAT
#ifndef DISABLE_OPENCV_SUPPORT
	if (bVideoInterface) CreateDefaultThread(VideoInterfaceThread, NULL, &VideoInterfaceThreadId);
	if (bVideoInterface) DetachThread(VideoInterfaceThreadId); // Not easy to stop it correctly...
#endif // !DISABLE_OPENCV_SUPPORT
	CreateDefaultThread(ObserverThread, NULL, &ObserverThreadId);
	CreateDefaultThread(ControllerThread, NULL, &ControllerThreadId);


	CreateDefaultThread(MissionThread, NULL, &MissionThreadId);
	CreateDefaultThread(MissionLogThread, NULL, &MissionLogThreadId);
	if (bCommandPrompt) CreateDefaultThread(CommandsThread, NULL, &CommandsThreadId);
	if (bCommandPrompt) if (bDetachCommandsThread) DetachThread(CommandsThreadId); // Not easy to stop it correctly...
#ifdef DISABLE_MISSIONARG_THREAD
#ifndef DISABLE_OPENCV_SUPPORT
#ifndef FORCE_SINGLE_THREAD_OPENCVGUI
	for (i = 0; i < nbopencvgui; i++)
	{
		CreateDefaultThread(OpenCVGUIThread, (void*)(intptr_t)i, &OpenCVGUIThreadId[i]);
	}
#endif // !FORCE_SINGLE_THREAD_OPENCVGUI
#endif // !DISABLE_OPENCV_SUPPORT
#endif // DISABLE_MISSIONARG_THREAD

	// Launch a mission file if specified as argument.
	if (bMissionAtStartup)
	{
#ifndef DISABLE_MISSIONARG_THREAD
		CreateDefaultThread(MissionArgThread, (void*)(argv[1]), &MissionArgThreadId);
#else
		CallMission(argv[1]);
#endif // !DISABLE_MISSIONARG_THREAD
	}
	else
	{
		bGUIAvailable = FALSE;
		for (i = 0; i < nbopencvgui; i++)
		{
			bGUIAvailable = bGUIAvailable||bEnableOpenCVGUIs[i];
		}
		if ((!bCommandPrompt)&&(!bGUIAvailable))
		{
			printf("No mission file specified as argument, command prompt disabled, no video GUI : will stop.\n");
			bExit = TRUE;
			ExitCode = EXIT_INVALID_PARAMETER;
		}
	}

#ifndef DISABLE_MISSIONARG_THREAD
#ifndef DISABLE_OPENCV_SUPPORT
#ifndef FORCE_SINGLE_THREAD_OPENCVGUI
	for (i = 0; i < nbopencvgui; i++)
	{
		CreateDefaultThread(OpenCVGUIThread, (void*)(intptr_t)i, &OpenCVGUIThreadId[i]);
	}
#endif // !FORCE_SINGLE_THREAD_OPENCVGUI
#endif // !DISABLE_OPENCV_SUPPORT
#endif // !DISABLE_MISSIONARG_THREAD

#ifndef DISABLE_OPENCV_SUPPORT
#ifndef FORCE_SINGLE_THREAD_OPENCVGUI
	for (i = nbopencvgui-1; i >= 0; i--)
	{
		WaitForThread(OpenCVGUIThreadId[i]);
	}
#else
#ifdef ENABLE_SHARED_WAITKEY_OPENCVGUI
	for (i = 0; i < nbopencvgui; i++)
	{
		CreateDefaultThread(OpenCVGUIThread, (void*)(intptr_t)i, &OpenCVGUIThreadId[i]);
	}
	for (;;)
	{
		int c = 0;

#ifdef ENABLE_OPENCV_HIGHGUI_THREADS_WORKAROUND
		EnterCriticalSection(&OpenCVGUICS);
#endif // ENABLE_OPENCV_HIGHGUI_THREADS_WORKAROUND
#ifndef USE_OPENCV_HIGHGUI_CPP_API
		c = cvWaitKey(opencvguiperiod);
#else
		c = cv::waitKey(opencvguiperiod);
#endif // !USE_OPENCV_HIGHGUI_CPP_API
#ifdef ENABLE_OPENCV_HIGHGUI_THREADS_WORKAROUND
		LeaveCriticalSection(&OpenCVGUICS);
#endif // ENABLE_OPENCV_HIGHGUI_THREADS_WORKAROUND

		EnterCriticalSection(&OpenCVGUICS);
		opencvguikey = c;
		LeaveCriticalSection(&OpenCVGUICS);

		if ((char)c == 27) // ESC
		{
			bExit = TRUE; 
			ExitCode = EXIT_SUCCESS;
		}

		if (bExit) break;
	}
	for (i = nbopencvgui-1; i >= 0; i--)
	{
		WaitForThread(OpenCVGUIThreadId[i]);
	}
#else
	UNREFERENCED_PARAMETER(OpenCVGUIThreadId);
	if (nbopencvgui >= 1) OpenCVGUIThread((void*)(intptr_t)0);
#endif // ENABLE_SHARED_WAITKEY_OPENCVGUI
#endif // !FORCE_SINGLE_THREAD_OPENCVGUI
#endif // !DISABLE_OPENCV_SUPPORT
#ifndef DISABLE_MISSIONARG_THREAD
	if (bMissionAtStartup) WaitForThread(MissionArgThreadId);
#endif // !DISABLE_MISSIONARG_THREAD
	if (bCommandPrompt)
	{
		if (bExit)
		{
			//// This should make fgets() return and let CommandsThread realize that 
			//// the program is stopping...
			//if (ungetc('\n', stdin) != '\n')
			//{
			//	// Wait a little bit and make another attempt...
			//	mSleep(3000);
			//	if (ungetc('\n', stdin) != '\n')
			//	{
			//		// Dirty way to kill the thread...
			//		KillOrCancelThreadMode(TRUE);
			//		mSleep(1000);
			//		KillThread(CommandsThreadId);
			//	}
			//}
			//mSleep(3000);
			//KillOrCancelThreadMode(TRUE);
			//// Cause deadlocks sometimes in release...?
			//KillThread(CommandsThreadId);
			//mSleep(1000);
//#ifdef ENABLE_CANCEL_THREAD
//			KillOrCancelThreadMode(FALSE);
//			CancelThread(CommandsThreadId);
//			mSleep(1000);
//#endif // ENABLE_CANCEL_THREAD
		}
		// Not easy to stop it correctly...
		if (!bDetachCommandsThread) WaitForThread(CommandsThreadId); else mSleep(100);
	}
	WaitForThread(MissionLogThreadId);
	WaitForThread(MissionThreadId);


	// Stop sensors, actuators, algorithms thread loops...
	WaitForThread(ControllerThreadId);
	WaitForThread(ObserverThreadId);
#ifndef DISABLE_OPENCV_SUPPORT
	// Not easy to stop it correctly...
	//if (bVideoInterface) WaitForThread(bVideoInterfaceThreadId);
	if (bVideoInterface) mSleep(100);
#endif // !DISABLE_OPENCV_SUPPORT
#ifndef ENABLE_BUILD_OPTIMIZATION_SAILBOAT
	// Not easy to stop it correctly...
	//if (bPololuInterface) WaitForThread(PololuInterfaceThreadId);
	if (bPololuInterface) mSleep(100);
	// Not easy to stop it correctly...
	//if (bSSC32Interface) WaitForThread(SSC32InterfaceThreadId);
	if (bSSC32Interface) mSleep(100);
	// Not easy to stop it correctly...
#ifdef ENABLE_MAVLINK_SUPPORT
	//if (bVectorNavInterface) WaitForThread(VectorNavInterfaceThreadId);
	if (bVectorNavInterface) mSleep(100);
#endif // ENABLE_MAVLINK_SUPPORT
	// Not easy to stop it correctly...
	//if (bSBGInterface) WaitForThread(SBGInterfaceThreadId);
	if (bSBGInterface) mSleep(100);
	// Not easy to stop it correctly...
	//if (bRoboteqInterface) WaitForThread(RoboteqInterfaceThreadId);
	if (bRoboteqInterface) mSleep(100);
	// Not easy to stop it correctly...
	//if (bRazorAHRSInterface) WaitForThread(RazorAHRSInterfaceThreadId);
	if (bRazorAHRSInterface) mSleep(100);
	// Not easy to stop it correctly...
	//if (bNMEAInterface) WaitForThread(NMEAInterfaceThreadId);
	if (bNMEAInterface) mSleep(100);
#endif // !ENABLE_BUILD_OPTIMIZATION_SAILBOAT
#ifdef ENABLE_MAVLINK_SUPPORT
	// Not easy to stop it correctly...
	//if (bMAVLinkInterface) WaitForThread(MAVLinkInterfaceThreadId);
	if (bMAVLinkInterface) mSleep(100);
#endif // ENABLE_MAVLINK_SUPPORT
#ifndef ENABLE_BUILD_OPTIMIZATION_SAILBOAT
	if (robid == LIRMIA3_ROBID) WaitForThread(LIRMIA3ThreadId);
#ifdef ENABLE_LIBMODBUS_SUPPORT
	if (robid == CISCREA_ROBID) WaitForThread(CISCREAThreadId);
#endif // ENABLE_LIBMODBUS_SUPPORT
	if (!bDisableOntrak) WaitForThread(OntrakThreadId);
	if (!bDisableIM483I) WaitForThread(IM483IThreadId);
	for (i = MAX_NB_ROBOTEQ-1; i >= 0; i--)
	{
		if (!bDisableRoboteq[i]) WaitForThread(RoboteqThreadId[i]);
	}
	if (!bDisableMiniSSC) WaitForThread(MiniSSCThreadId);
#endif // !ENABLE_BUILD_OPTIMIZATION_SAILBOAT
	for (i = MAX_NB_POLOLU-1; i >= 0; i--)
	{
		if (!bDisablePololu[i]) WaitForThread(PololuThreadId[i]);
	}
#ifndef ENABLE_BUILD_OPTIMIZATION_SAILBOAT
	if (!bDisableSSC32) WaitForThread(SSC32ThreadId);
#ifdef ENABLE_LABJACK_SUPPORT
	if (!bDisableUE9A) WaitForThread(UE9AThreadId);
#endif // ENABLE_LABJACK_SUPPORT
	if (!bDisableSwarmonDevice) WaitForThread(SwarmonDeviceThreadId);
#ifdef ENABLE_MAVLINK_SUPPORT
	for (i = MAX_NB_MAVLINKDEVICE-1; i >= 0; i--)
	{
		if (!bDisableMAVLinkDevice[i]) WaitForThread(MAVLinkDeviceThreadId[i]);
	}
#endif // ENABLE_MAVLINK_SUPPORT
	for (i = MAX_NB_UBLOX-1; i >= 0; i--)
	{
		if (!bDisableublox[i]) WaitForThread(ubloxThreadId[i]);
	}
#endif // !ENABLE_BUILD_OPTIMIZATION_SAILBOAT
	for (i = MAX_NB_NMEADEVICE-1; i >= 0; i--)
	{
		if (!bDisableNMEADevice[i]) WaitForThread(NMEADeviceThreadId[i]);
	}
#ifndef ENABLE_BUILD_OPTIMIZATION_SAILBOAT
	if (!bDisableSBG) WaitForThread(SBGThreadId);
	if (!bDisableMT) WaitForThread(MTThreadId);
#endif // !ENABLE_BUILD_OPTIMIZATION_SAILBOAT
	if (!bDisableRazorAHRS) WaitForThread(RazorAHRSThreadId);
#ifndef ENABLE_BUILD_OPTIMIZATION_SAILBOAT
	if (!bDisableP33x) WaitForThread(P33xThreadId);
	if (!bDisableMS5837) WaitForThread(MS5837ThreadId);
	if (!bDisableMS580314BA) WaitForThread(MS580314BAThreadId);
	if (!bDisableArduinoPressureSensor) WaitForThread(ArduinoPressureSensorThreadId);
	if (!bDisableSRF02) WaitForThread(SRF02ThreadId);
	if (!bDisableRPLIDAR) WaitForThread(RPLIDARThreadId);
	if (!bDisableHokuyo) WaitForThread(HokuyoThreadId);
#ifdef ENABLE_BLUEVIEW_SUPPORT
	for (i = MAX_NB_BLUEVIEW-1; i >= 0; i--)
	{
		if (!bDisableBlueView[i]) WaitForThread(BlueViewThreadId[i]);
	}
#endif // ENABLE_BLUEVIEW_SUPPORT
	if (!bDisableSeanet) WaitForThread(SeanetThreadId);
	if (!bDisableMDM) WaitForThread(MDMThreadId);
	if (!bDisableMES) WaitForThread(MESThreadId);
	if (!bDisableNortekDVL) WaitForThread(NortekDVLThreadId);
	if (!bDisablePathfinderDVL) WaitForThread(PathfinderDVLThreadId);
	if (robid & SIMULATOR_ROBID_MASK) WaitForThread(SimulatorThreadId);
	if (!bDisableFollowMe) WaitForThread(FollowMeThreadId);
	for (i = MAX_NB_EXTERNALPROGRAMTRIGGER-1; i >= 0; i--)
	{
		if (!bDisableExternalProgramTrigger) WaitForThread(ExternalProgramTriggerThreadId[i]);
	}
#ifndef DISABLE_OPENCV_SUPPORT
	if (!bDisablePinger) WaitForThread(PingerThreadId);
	WaitForThread(ObstacleThreadId);
	WaitForThread(SurfaceVisualObstacleThreadId);
#endif // !DISABLE_OPENCV_SUPPORT
#endif // !ENABLE_BUILD_OPTIMIZATION_SAILBOAT
#ifndef DISABLE_OPENCV_SUPPORT
	for (i = MAX_NB_BALL-1; i >= 0; i--)
	{
		if (!bDisableBall) WaitForThread(BallThreadId[i]);
	}
#endif // !DISABLE_OPENCV_SUPPORT
#ifndef ENABLE_BUILD_OPTIMIZATION_SAILBOAT
#ifndef DISABLE_OPENCV_SUPPORT
	if (!bDisableWall) WaitForThread(WallThreadId);
	if (!bDisableExternalVisualLocalization) WaitForThread(ExternalVisualLocalizationThreadId);
#endif // !DISABLE_OPENCV_SUPPORT
	WaitForThread(SonarAltitudeEstimationThreadId);
	WaitForThread(SonarLocalizationThreadId);
	WaitForThread(SeanetProcessingThreadId);
#endif // !ENABLE_BUILD_OPTIMIZATION_SAILBOAT
#ifndef DISABLE_OPENCV_SUPPORT
	for (i = MAX_NB_VIDEO-1; i >= 0; i--)
	{
		if (!bDisableVideo[i]) WaitForThread(VideoRecordThreadId[i]);
		if (!bDisableVideo[i]) WaitForThread(VideoThreadId[i]);
	}
#endif // !DISABLE_OPENCV_SUPPORT
	if (!bDisablegpControl) WaitForThread(gpControlThreadId);

#ifdef _WIN32
	// Allow the system to idle to sleep normally.
	SetThreadExecutionState(ES_CONTINUOUS);
#endif // _WIN32

	ReleaseGlobals();
	UnloadEnv();

#ifndef DISABLE_LOGAPP
	if (logappfile) fclose(logappfile);
#endif // !DISABLE_LOGAPP

	if (ExitCode == EXIT_SUCCESS)
	{
		unlink(LOG_FOLDER"CurLbl.txt");
		unlink(LOG_FOLDER"CurWp.txt");
	}

	return ExitCode;
}